

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O1

Error __thiscall asmjit::x86::Compiler::onAttach(Compiler *this,CodeHolder *code)

{
  Error EVar1;
  Error local_1c;
  
  EVar1 = 4;
  if (((code->_environment)._arch - 1 < 2) &&
     (EVar1 = BaseCompiler::onAttach(&this->super_BaseCompiler,code), EVar1 == 0)) {
    onAttach();
    EVar1 = local_1c;
  }
  return EVar1;
}

Assistant:

inline uint32_t arch() const noexcept { return _arch; }